

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.h
# Opt level: O1

void __thiscall
entityx::SystemManager::add<entityx::deps::Dependency<A,B,C>>
          (SystemManager *this,shared_ptr<entityx::deps::Dependency<A,_B,_C>_> *system)

{
  Family local_28;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_28 = System<entityx::deps::Dependency<A,_B,_C>_>::family();
  local_20 = (system->
             super___shared_ptr<entityx::deps::Dependency<A,_B,_C>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  local_18 = (system->
             super___shared_ptr<entityx::deps::Dependency<A,_B,_C>,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
    }
  }
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<entityx::BaseSystem>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<entityx::BaseSystem>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_long,std::shared_ptr<entityx::deps::Dependency<A,B,C>>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<entityx::BaseSystem>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<entityx::BaseSystem>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->systems_,&local_28);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

void add(std::shared_ptr<S> system) {
    systems_.insert(std::make_pair(S::family(), system));
  }